

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O0

void Omega_h::sort_by_high_index(LOs *l2lh,Write<int> *lh2h,Write<signed_char> *codes)

{
  char *file;
  undefined1 local_118 [8];
  type f;
  __cxx11 local_e0 [4];
  LO nl;
  allocator local_a9;
  string local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [39];
  ScopedTimer local_41;
  Write<signed_char> *pWStack_40;
  ScopedTimer omega_h_scoped_function_timer;
  Write<signed_char> *codes_local;
  Write<int> *lh2h_local;
  LOs *l2lh_local;
  ulong local_10;
  
  pWStack_40 = codes;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
             ,&local_a9);
  std::operator+(local_88,(char *)local_a8);
  std::__cxx11::to_string(local_e0,0xb4);
  std::operator+(local_68,local_88);
  file = (char *)std::__cxx11::string::c_str();
  ScopedTimer::ScopedTimer(&local_41,"sort_by_high_index",file);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)local_e0);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  if (((ulong)(l2lh->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((l2lh->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(l2lh->write_).shared_alloc_.alloc >> 3;
  }
  f.codes.shared_alloc_.direct_ptr._4_4_ = (int)(local_10 >> 2) + -1;
  Read<int>::Read((Read<int> *)local_118,l2lh);
  Write<int>::Write((Write<int> *)&f.l2lh.write_.shared_alloc_.direct_ptr,lh2h);
  Write<signed_char>::Write((Write<signed_char> *)&f.lh2h.shared_alloc_.direct_ptr,codes);
  parallel_for<Omega_h::sort_by_high_index(Omega_h::Read<int>,Omega_h::Write<int>,Omega_h::Write<signed_char>)::__0>
            (f.codes.shared_alloc_.direct_ptr._4_4_,(type *)local_118);
  sort_by_high_index(Omega_h::Read<int>,Omega_h::Write<int>,Omega_h::Write<signed_char>)::$_0::~__0
            ((__0 *)local_118);
  ScopedTimer::~ScopedTimer(&local_41);
  return;
}

Assistant:

void sort_by_high_index(
    LOs const l2lh, Write<LO> const lh2h, Write<I8> const codes) {
  OMEGA_H_TIME_FUNCTION;
  LO const nl = l2lh.size() - 1;
  auto f = OMEGA_H_LAMBDA(LO const l) {
    LO const begin = l2lh[l];
    LO const end = l2lh[l + 1];
    for (LO j = begin; j < end; ++j) {
      LO k_min = j;
      GO min_h = lh2h[j];
      for (LO k = j + 1; k < end; ++k) {
        GO const h = lh2h[k];
        if (h < min_h) {
          k_min = k;
          min_h = h;
        }
      }
      swap2(lh2h[j], lh2h[k_min]);
      swap2(codes[j], codes[k_min]);
    }
  };
  parallel_for(nl, std::move(f));
}